

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::increment_abs(char *ext)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  ushort uVar5;
  ulong uVar6;
  ulong uVar7;
  short sVar8;
  uint uVar9;
  
  uVar3 = *(ushort *)(ext + 2);
  uVar5 = 0;
  if (0 < (short)uVar3) {
    uVar5 = uVar3;
  }
  if (uVar5 <= *(ushort *)ext) {
    if (0 < (short)uVar3) {
      uVar6 = (ulong)uVar5;
      sVar8 = uVar5 * 4;
      do {
        sVar8 = sVar8 + -4;
        uVar6 = uVar6 - 1;
        uVar7 = uVar6 >> 1;
        bVar2 = ext[uVar7 + 5];
        uVar9 = (uint)(int)(char)bVar2 >> (~(byte)sVar8 & 4);
        if ((uVar9 & 0xf) != 9) {
          bVar4 = (byte)uVar6 & 1;
          ext[uVar7 + 5] =
               (byte)((uVar9 + 1 & 0xf) << (bVar4 * '\x04' ^ 4)) | '\x0f' << (bVar4 << 2) & bVar2;
          goto LAB_00238b9d;
        }
        ext[uVar7 + 5] = '\x0f' << ((byte)sVar8 & 4) & bVar2;
      } while (uVar6 != 0);
    }
    while ((short)uVar3 < 0) {
      shift_right(ext,1);
      puVar1 = (ushort *)(ext + 2);
      *puVar1 = *puVar1 + 1;
      uVar3 = *puVar1;
    }
    shift_right(ext,1);
    *(short *)(ext + 2) = *(short *)(ext + 2) + 1;
    ext[5] = ext[5] & 0xfU | 0x10;
LAB_00238b9d:
    ext[4] = ext[4] & 0xf7;
  }
  return;
}

Assistant:

void CVmObjBigNum::increment_abs(char *ext)
{
    size_t idx;
    int exp = get_exp(ext);
    int carry;

    /* start at the one's place, if represented */
    idx = (exp <= 0 ? 0 : (size_t)exp);

    /* 
     *   if the units digit is to the right of the number (i.e., the number's
     *   scale is large), there's nothing to do 
     */
    if (idx > get_prec(ext))
        return;

    /* increment digits */
    for (carry = TRUE ; idx != 0 ; )
    {
        int dig;

        /* move to the next digit */
        --idx;

        /* get the digit value */
        dig = get_dig(ext, idx);

        /* increment it, checking for carry */
        if (dig == 9)
        {
            /* increment it to zero and keep going to carry */
            set_dig(ext, idx, 0);
        }
        else
        {
            /* increment this digit */
            set_dig(ext, idx, dig + 1);

            /* there's no carry out */
            carry = FALSE;

            /* done */
            break;
        }
    }

    /* if we carried past the end of the number, insert the leading 1 */
    if (carry)
    {
        /* 
         *   if we still haven't reached the units position, shift right
         *   until we do 
         */
        while (get_exp(ext) < 0)
        {
            /* shift it right and adjust the exponent */
            shift_right(ext, 1);
            set_exp(ext, get_exp(ext) + 1);
        }

        /* shift the number right and adjust the exponent */
        shift_right(ext, 1);
        set_exp(ext, get_exp(ext) + 1);

        /* insert the leading 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is now non-zero */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}